

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O2

void __thiscall cppcms::impl::file_server::load_mime_types(file_server *this,string *file_name)

{
  long lVar1;
  istream *piVar2;
  mapped_type *pmVar3;
  string line;
  string ext;
  string mime;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  ifstream inp;
  byte abStack_398 [488];
  istringstream ss;
  
  std::ifstream::ifstream(&inp,(file_name->_M_dataplus)._M_p,_S_in);
  lVar1 = *(long *)(_inp + -0x18);
  if ((abStack_398[lVar1] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while (((abStack_398[lVar1] & 2) == 0 &&
           (piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)&inp,(string *)&line),
           ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0))) {
      if ((line._M_string_length != 0) && (*line._M_dataplus._M_p != '#')) {
        std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&line,_S_in);
        mime._M_dataplus._M_p = (pointer)&mime.field_2;
        mime._M_string_length = 0;
        mime.field_2._M_local_buf[0] = '\0';
        ext._M_dataplus._M_p = (pointer)&ext.field_2;
        ext._M_string_length = 0;
        ext.field_2._M_local_buf[0] = '\0';
        piVar2 = std::operator>>((istream *)&ss,(string *)&mime);
        if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
          while (piVar2 = std::operator>>((istream *)&ss,(string *)&ext),
                ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
            std::operator+(&local_3d8,".",&ext);
            pmVar3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&this->mime_,&local_3d8);
            std::__cxx11::string::_M_assign((string *)pmVar3);
            std::__cxx11::string::~string((string *)&local_3d8);
          }
        }
        std::__cxx11::string::~string((string *)&ext);
        std::__cxx11::string::~string((string *)&mime);
        std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
      }
      lVar1 = *(long *)(_inp + -0x18);
    }
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&inp);
  return;
}

Assistant:

void file_server::load_mime_types(std::string file_name)
{
	booster::nowide::ifstream inp(file_name.c_str());
	if(!inp) {
		return;
	}
	std::string line;
	while(!inp.eof() && getline(inp,line)) {
		if(line.empty() || line[0]=='#')
			continue;
		std::istringstream ss(line);
		std::string mime;
		std::string ext;
		if(ss>>mime) {
			while(ss>>ext) {
				mime_["."+ext]=mime;
			}
		}
	}
}